

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O3

void __thiscall helics::ConnectorFederateManager::closeAllConnectors(ConnectorFederateManager *this)

{
  uint uVar1;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **ppuVar2;
  Translator **ppTVar3;
  long lVar4;
  uint uVar5;
  uint uVar6;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **ppuVar7;
  Translator **ppTVar8;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **ppuVar9;
  Translator *this_00;
  unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *puVar10;
  Translator **ppTVar11;
  handle trans;
  handle filts;
  handle local_60;
  handle local_48;
  
  if (this->coreObject != (Core *)0x0) {
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
    ::lock(&local_48,&this->filters);
    if (((local_48.data)->dataStorage).csize == 0) {
      uVar1 = ((local_48.data)->dataStorage).bsize;
      ppuVar2 = ((local_48.data)->dataStorage).dataptr;
      if ((long)(int)uVar1 == 0x20) {
        lVar4 = (long)((local_48.data)->dataStorage).dataSlotIndex;
        if (ppuVar2 == (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
          ppuVar9 = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)
                    &gmlc::containers::
                     StableBlockVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,5u,std::allocator<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>>
                     ::end()::emptyValue;
        }
        else {
          ppuVar9 = ppuVar2 + lVar4 + 1;
        }
        puVar10 = *ppuVar9;
        uVar1 = 0;
        uVar5 = 0x20;
      }
      else {
        lVar4 = (long)((local_48.data)->dataStorage).dataSlotIndex;
        ppuVar9 = ppuVar2 + lVar4;
        puVar10 = *ppuVar9 + (int)uVar1;
        uVar5 = uVar1;
      }
    }
    else {
      ppuVar2 = ((local_48.data)->dataStorage).dataptr;
      puVar10 = *ppuVar2;
      lVar4 = (long)((local_48.data)->dataStorage).dataSlotIndex;
      uVar1 = 0;
      ppuVar9 = ppuVar2;
      uVar5 = ((local_48.data)->dataStorage).bsize;
    }
    if (ppuVar2 == (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)0x0) {
      ppuVar7 = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> **)
                &gmlc::containers::
                 StableBlockVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,5u,std::allocator<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>>
                 ::end()::emptyValue;
    }
    else {
      ppuVar7 = ppuVar2 + lVar4 + 1;
    }
    uVar6 = 0;
    if (uVar5 != 0x20) {
      ppuVar7 = ppuVar2 + lVar4;
      uVar6 = uVar5;
    }
    while ((uVar1 != uVar6 || (ppuVar9 != ppuVar7))) {
      (*this->coreObject->_vptr_Core[0x30])
                (this->coreObject,
                 (ulong)(uint)(((puVar10->_M_t).
                                super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>
                                .super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl)->
                              super_Interface).handle.hid);
      Interface::disconnectFromCore
                (&((puVar10->_M_t).
                   super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>._M_t.
                   super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>.
                   super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl)->super_Interface);
      if ((int)uVar1 < 0x1f) {
        puVar10 = puVar10 + 1;
        uVar1 = uVar1 + 1;
      }
      else {
        ppuVar9 = ppuVar9 + (ulong)(uVar1 - 0x1f >> 5) + 1;
        uVar1 = uVar1 + 1 & 0x1f;
        puVar10 = (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
                  ((long)&((*ppuVar9)->_M_t).
                          super___uniq_ptr_impl<helics::Filter,_std::default_delete<helics::Filter>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_helics::Filter_*,_std::default_delete<helics::Filter>_>
                          .super__Head_base<0UL,_helics::Filter_*,_false>._M_head_impl +
                  (ulong)(uVar1 * 8));
      }
    }
    gmlc::libguarded::
    shared_guarded_opt<gmlc::containers::StringMappedVector<helics::Translator,_(reference_stability)0,_5>,_std::shared_mutex>
    ::lock(&local_60,&this->translators);
    if (((local_60.data)->dataStorage).csize == 0) {
      uVar1 = ((local_60.data)->dataStorage).bsize;
      ppTVar3 = ((local_60.data)->dataStorage).dataptr;
      if ((long)(int)uVar1 == 0x20) {
        lVar4 = (long)((local_60.data)->dataStorage).dataSlotIndex;
        if (ppTVar3 == (Translator **)0x0) {
          ppTVar11 = (Translator **)
                     &gmlc::containers::
                      StableBlockVector<helics::Translator,5u,std::allocator<helics::Translator>>::
                      end()::emptyValue;
        }
        else {
          ppTVar11 = ppTVar3 + lVar4 + 1;
        }
        this_00 = *ppTVar11;
        uVar1 = 0;
        uVar5 = 0x20;
      }
      else {
        lVar4 = (long)((local_60.data)->dataStorage).dataSlotIndex;
        ppTVar11 = ppTVar3 + lVar4;
        this_00 = *ppTVar11 + (int)uVar1;
        uVar5 = uVar1;
      }
    }
    else {
      ppTVar3 = ((local_60.data)->dataStorage).dataptr;
      this_00 = *ppTVar3;
      lVar4 = (long)((local_60.data)->dataStorage).dataSlotIndex;
      uVar1 = 0;
      ppTVar11 = ppTVar3;
      uVar5 = ((local_60.data)->dataStorage).bsize;
    }
    if (ppTVar3 == (Translator **)0x0) {
      ppTVar8 = (Translator **)
                &gmlc::containers::
                 StableBlockVector<helics::Translator,5u,std::allocator<helics::Translator>>::end()
                 ::emptyValue;
    }
    else {
      ppTVar8 = ppTVar3 + lVar4 + 1;
    }
    uVar6 = 0;
    if (uVar5 != 0x20) {
      ppTVar8 = ppTVar3 + lVar4;
      uVar6 = uVar5;
    }
    while ((uVar1 != uVar6 || (ppTVar11 != ppTVar8))) {
      (*this->coreObject->_vptr_Core[0x30])
                (this->coreObject,(ulong)(uint)(this_00->super_Interface).handle.hid);
      Interface::disconnectFromCore(&this_00->super_Interface);
      if ((int)uVar1 < 0x1f) {
        this_00 = this_00 + 1;
        uVar1 = uVar1 + 1;
      }
      else {
        ppTVar11 = ppTVar11 + (ulong)(uVar1 - 0x1f >> 5) + 1;
        uVar1 = uVar1 + 1 & 0x1f;
        this_00 = (Translator *)
                  ((long)&((*ppTVar11)->super_Interface)._vptr_Interface + (ulong)(uVar1 * 0x50));
      }
    }
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_60.m_handle_lock);
    std::unique_lock<std::shared_mutex>::~unique_lock(&local_48.m_handle_lock);
  }
  return;
}

Assistant:

void ConnectorFederateManager::closeAllConnectors()
{
    if (coreObject != nullptr) {
        auto filts = filters.lock();
        filts->modify([this](auto& filt) {
            coreObject->closeHandle(filt->getHandle());
            filt->disconnectFromCore();
        });

        auto trans = translators.lock();
        trans->modify([this](auto& tran) {
            coreObject->closeHandle(tran.getHandle());
            tran.disconnectFromCore();
        });
    }
}